

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FactorisedJoin.h
# Opt level: O3

void __thiscall FactorisedJoin::PartitionAttributes::~PartitionAttributes(PartitionAttributes *this)

{
  vector<node::Union_*,_std::allocator<node::Union_*>_> *pvVar1;
  pointer ppUVar2;
  void *pvVar3;
  vector<double,_std::allocator<double>_> *pvVar4;
  pointer pdVar5;
  long lVar6;
  ulong uVar7;
  
  if (dfdb::params::NUM_OF_ATTRIBUTES != 0) {
    uVar7 = 0;
    do {
      if (this->ordering[uVar7] != (int *)0x0) {
        operator_delete__(this->ordering[uVar7]);
      }
      if (this->LOWERBOUND[uVar7] != (int *)0x0) {
        operator_delete__(this->LOWERBOUND[uVar7]);
      }
      if (this->UPPERBOUND[uVar7] != (int *)0x0) {
        operator_delete__(this->UPPERBOUND[uVar7]);
      }
      if (this->localPointerPlaceholder[uVar7] != (Union **)0x0) {
        operator_delete__(this->localPointerPlaceholder[uVar7]);
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 < dfdb::params::NUM_OF_ATTRIBUTES);
  }
  if (this->ordering != (int **)0x0) {
    operator_delete__(this->ordering);
  }
  if (this->LOWERBOUND != (int **)0x0) {
    operator_delete__(this->LOWERBOUND);
  }
  if (this->UPPERBOUND != (int **)0x0) {
    operator_delete__(this->UPPERBOUND);
  }
  if (this->varMap != (double *)0x0) {
    operator_delete__(this->varMap);
  }
  pvVar1 = this->pointers;
  if (pvVar1 != (vector<node::Union_*,_std::allocator<node::Union_*>_> *)0x0) {
    ppUVar2 = pvVar1[-1].super__Vector_base<node::Union_*,_std::allocator<node::Union_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
    if (ppUVar2 != (pointer)0x0) {
      lVar6 = (long)ppUVar2 * 0x18;
      do {
        pvVar3 = *(void **)((long)&pvVar1[-1].
                                   super__Vector_base<node::Union_*,_std::allocator<node::Union_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start + lVar6);
        if (pvVar3 != (void *)0x0) {
          operator_delete(pvVar3);
        }
        lVar6 = lVar6 + -0x18;
      } while (lVar6 != 0);
    }
    operator_delete__(&pvVar1[-1].super__Vector_base<node::Union_*,_std::allocator<node::Union_*>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  pvVar4 = this->values;
  if (pvVar4 != (vector<double,_std::allocator<double>_> *)0x0) {
    pdVar5 = pvVar4[-1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    if (pdVar5 != (pointer)0x0) {
      lVar6 = (long)pdVar5 * 0x18;
      do {
        pvVar3 = *(void **)((long)&pvVar4[-1].super__Vector_base<double,_std::allocator<double>_>.
                                   _M_impl.super__Vector_impl_data._M_start + lVar6);
        if (pvVar3 != (void *)0x0) {
          operator_delete(pvVar3);
        }
        lVar6 = lVar6 + -0x18;
      } while (lVar6 != 0);
    }
    operator_delete__(&pvVar4[-1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
  }
  if (this->localPointerPlaceholder != (Union ***)0x0) {
    operator_delete__(this->localPointerPlaceholder);
    return;
  }
  return;
}

Assistant:

~PartitionAttributes()
		{
			for (size_t i = 0; i < dfdb::params::NUM_OF_ATTRIBUTES; ++i)
			{
				delete[] ordering[i];
				delete[] LOWERBOUND[i];
				delete[] UPPERBOUND[i];
				delete[] localPointerPlaceholder[i];
			}

			delete[] ordering;
			delete[] LOWERBOUND;
			delete[] UPPERBOUND;
			delete[] varMap;

			delete[] pointers;
			delete[] values;
			delete[] localPointerPlaceholder;
		}